

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O3

bool __thiscall
cmCTestBuildCommand::InitialPass
          (cmCTestBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  pointer ppcVar3;
  ostringstream str;
  allocator<char> local_1d1;
  long *local_1d0;
  long local_1c0 [2];
  string local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  bVar2 = cmCTestHandlerCommand::InitialPass(&this->super_cmCTestHandlerCommand,args,status);
  ppcVar3 = (this->super_cmCTestHandlerCommand).Values.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ppcVar3[7] != (char *)0x0) && (*ppcVar3[7] != '\0')) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::operator<<(local_190,this->Handler->TotalErrors);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[7],&local_1d1);
    std::__cxx11::stringbuf::str();
    cmMakefile::AddDefinition(pcVar1,&local_1b0,(char *)local_1d0);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
    ppcVar3 = (this->super_cmCTestHandlerCommand).Values.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if ((ppcVar3[8] != (char *)0x0) && (*ppcVar3[8] != '\0')) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::operator<<(local_190,this->Handler->TotalWarnings);
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[8],&local_1d1);
    std::__cxx11::stringbuf::str();
    cmMakefile::AddDefinition(pcVar1,&local_1b0,(char *)local_1d0);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return bVar2;
}

Assistant:

bool cmCTestBuildCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  bool ret = cmCTestHandlerCommand::InitialPass(args, status);
  if (this->Values[ctb_NUMBER_ERRORS] && *this->Values[ctb_NUMBER_ERRORS]) {
    std::ostringstream str;
    str << this->Handler->GetTotalErrors();
    this->Makefile->AddDefinition(this->Values[ctb_NUMBER_ERRORS],
                                  str.str().c_str());
  }
  if (this->Values[ctb_NUMBER_WARNINGS] &&
      *this->Values[ctb_NUMBER_WARNINGS]) {
    std::ostringstream str;
    str << this->Handler->GetTotalWarnings();
    this->Makefile->AddDefinition(this->Values[ctb_NUMBER_WARNINGS],
                                  str.str().c_str());
  }
  return ret;
}